

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fVertexAttributeBindingTests.cpp
# Opt level: O0

int __thiscall
deqp::gles31::Functional::anon_unknown_0::MultipleBindingCase::init
          (MultipleBindingCase *this,EVP_PKEY_CTX *ctx)

{
  int extraout_EAX;
  TestLog *this_00;
  MessageBuilder *pMVar1;
  GLuint *local_250;
  int local_1ac;
  uint local_1a8 [6];
  MessageBuilder local_190;
  MultipleBindingCase *local_10;
  MultipleBindingCase *this_local;
  
  local_10 = this;
  BindingRenderCase::init(&this->super_BindingRenderCase,ctx);
  this_00 = tcu::TestContext::getLog
                      ((this->super_BindingRenderCase).super_TestCase.super_TestCase.super_TestNode.
                       m_testCtx);
  tcu::TestLog::operator<<(&local_190,this_00,(BeginMessageToken *)&tcu::TestLog::Message);
  pMVar1 = tcu::MessageBuilder::operator<<(&local_190,(char (*) [11])"Rendering ");
  local_1a8[2] = 0x14;
  pMVar1 = tcu::MessageBuilder::operator<<(pMVar1,(int *)(local_1a8 + 2));
  pMVar1 = tcu::MessageBuilder::operator<<(pMVar1,(char (*) [2])0x2a8224a);
  local_1a8[1] = 0x14;
  pMVar1 = tcu::MessageBuilder::operator<<(pMVar1,(int *)(local_1a8 + 1));
  pMVar1 = tcu::MessageBuilder::operator<<(pMVar1,(char (*) [8])0x2c336dd);
  pMVar1 = tcu::MessageBuilder::operator<<(pMVar1,(char (*) [19])"Vertex positions:\n");
  pMVar1 = tcu::MessageBuilder::operator<<(pMVar1,(char (*) [19])"\tbinding point: 1\n");
  pMVar1 = tcu::MessageBuilder::operator<<(pMVar1,(char (*) [17])"Vertex offsets:\n");
  pMVar1 = tcu::MessageBuilder::operator<<(pMVar1,(char (*) [19])"\tbinding point: 2\n");
  pMVar1 = tcu::MessageBuilder::operator<<(pMVar1,(char (*) [16])"Vertex colors:\n");
  pMVar1 = tcu::MessageBuilder::operator<<(pMVar1,(char (*) [19])"\tbinding point: 2\n");
  pMVar1 = tcu::MessageBuilder::operator<<(pMVar1,(char (*) [18])"Binding point 1:\n");
  pMVar1 = tcu::MessageBuilder::operator<<(pMVar1,(char (*) [17])"\tbuffer object: ");
  pMVar1 = tcu::MessageBuilder::operator<<(pMVar1,&this->m_primitiveBuf);
  pMVar1 = tcu::MessageBuilder::operator<<(pMVar1,(char (*) [2])0x2b8f97b);
  pMVar1 = tcu::MessageBuilder::operator<<(pMVar1,(char (*) [18])"Binding point 2:\n");
  pMVar1 = tcu::MessageBuilder::operator<<(pMVar1,(char (*) [17])"\tbuffer object: ");
  if (((this->m_spec).aliasingBuffers & 1U) == 0) {
    local_250 = &this->m_colorOffsetBuf;
  }
  else {
    local_250 = &this->m_primitiveBuf;
  }
  pMVar1 = tcu::MessageBuilder::operator<<(pMVar1,local_250);
  pMVar1 = tcu::MessageBuilder::operator<<(pMVar1,(char (*) [2])0x2b8f97b);
  pMVar1 = tcu::MessageBuilder::operator<<(pMVar1,(char (*) [20])"\tinstance divisor: ");
  local_1a8[0] = (this->m_spec).instanced & 1;
  pMVar1 = tcu::MessageBuilder::operator<<(pMVar1,(int *)local_1a8);
  pMVar1 = tcu::MessageBuilder::operator<<(pMVar1,(char (*) [2])0x2b8f97b);
  pMVar1 = tcu::MessageBuilder::operator<<(pMVar1,(char (*) [10])"\tstride: ");
  local_1ac = ((byte)~(this->m_spec).zeroStride & 1) << 5;
  pMVar1 = tcu::MessageBuilder::operator<<(pMVar1,&local_1ac);
  pMVar1 = tcu::MessageBuilder::operator<<(pMVar1,(char (*) [2])0x2b8f97b);
  tcu::MessageBuilder::operator<<(pMVar1,(EndMessageToken *)&tcu::TestLog::EndMessage);
  tcu::MessageBuilder::~MessageBuilder(&local_190);
  return extraout_EAX;
}

Assistant:

void MultipleBindingCase::init (void)
{
	BindingRenderCase::init();

	// log what we are trying to do

	m_testCtx.getLog()	<< tcu::TestLog::Message
						<< "Rendering " << (int)GRID_SIZE << "x" << (int)GRID_SIZE << " grid.\n"
						<< "Vertex positions:\n"
						<< "	binding point: 1\n"
						<< "Vertex offsets:\n"
						<< "	binding point: 2\n"
						<< "Vertex colors:\n"
						<< "	binding point: 2\n"
						<< "Binding point 1:\n"
						<< "	buffer object: " << m_primitiveBuf << "\n"
						<< "Binding point 2:\n"
						<< "	buffer object: " << ((m_spec.aliasingBuffers) ? (m_primitiveBuf) : (m_colorOffsetBuf)) << "\n"
						<< "	instance divisor: " << ((m_spec.instanced) ? (1) : (0)) << "\n"
						<< "	stride: " << ((m_spec.zeroStride) ? (0) : (4*4*2)) << "\n"
						<< tcu::TestLog::EndMessage;
}